

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPersistentManifold.cpp
# Opt level: O1

int __thiscall
btPersistentManifold::addManifoldPoint
          (btPersistentManifold *this,btManifoldPoint *newPoint,bool isPredictive)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = this->m_cachedPoints;
  if (uVar2 == 4) {
    uVar2 = sortCachedPoints(this,newPoint);
    pvVar1 = this->m_pointCache[(int)uVar2].m_userPersistentData;
    if ((pvVar1 != (void *)0x0) && (gContactDestroyedCallback != (ContactDestroyedCallback)0x0)) {
      (*gContactDestroyedCallback)(pvVar1);
      this->m_pointCache[(int)uVar2].m_userPersistentData = (void *)0x0;
    }
  }
  else {
    this->m_cachedPoints = uVar2 + 1;
  }
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  memcpy(this->m_pointCache + uVar3,newPoint,0xbc);
  return (int)uVar3;
}

Assistant:

int btPersistentManifold::addManifoldPoint(const btManifoldPoint& newPoint, bool isPredictive)
{
	if (!isPredictive)
	{
		btAssert(validContactDistance(newPoint));
	}
	
	int insertIndex = getNumContacts();
	if (insertIndex == MANIFOLD_CACHE_SIZE)
	{
#if MANIFOLD_CACHE_SIZE >= 4
		//sort cache so best points come first, based on area
		insertIndex = sortCachedPoints(newPoint);
#else
		insertIndex = 0;
#endif
		clearUserCache(m_pointCache[insertIndex]);
		
	} else
	{
		m_cachedPoints++;

		
	}
	if (insertIndex<0)
		insertIndex=0;

	btAssert(m_pointCache[insertIndex].m_userPersistentData==0);
	m_pointCache[insertIndex] = newPoint;
	return insertIndex;
}